

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

void mpack_tree_init_pool
               (mpack_tree_t *tree,char *data,size_t length,mpack_node_data_t *node_pool,
               size_t node_pool_count)

{
  memset(tree,0,0xa0);
  (tree->nil_node).type = mpack_type_nil;
  *(undefined4 *)&tree->max_size = 0xffffffff;
  *(undefined4 *)((long)&tree->max_size + 4) = 0xffffffff;
  *(undefined4 *)&tree->max_nodes = 0xffffffff;
  *(undefined4 *)((long)&tree->max_nodes + 4) = 0xffffffff;
  tree->next = (mpack_tree_page_t *)0x0;
  if (node_pool_count == 0) {
    if (tree->error == mpack_ok) {
      tree->error = mpack_error_bug;
      if (tree->error_fn != (mpack_tree_error_t)0x0) {
        (*tree->error_fn)(tree,mpack_error_bug);
        return;
      }
    }
  }
  else {
    tree->data = data;
    tree->data_length = length;
    tree->pool = node_pool;
    tree->pool_count = node_pool_count;
  }
  return;
}

Assistant:

void mpack_tree_init_pool(mpack_tree_t* tree, const char* data, size_t length,
        mpack_node_data_t* node_pool, size_t node_pool_count)
{
    mpack_tree_init_clear(tree);
    #ifdef MPACK_MALLOC
    tree->next = NULL;
    #endif

    if (node_pool_count == 0) {
        mpack_break("initial page has no nodes!");
        mpack_tree_flag_error(tree, mpack_error_bug);
        return;
    }

    tree->data = data;
    tree->data_length = length;
    tree->pool = node_pool;
    tree->pool_count = node_pool_count;

    mpack_log("===========================\n");
    mpack_log("initializing tree with data of size %i and pool of count %i\n",
            (int)length, (int)node_pool_count);
}